

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u8 uVar1;
  u8 uVar2;
  undefined4 uVar3;
  Fts3Cursor *pCsr;
  sqlite3_vtab *pCtx_00;
  u32 *puVar4;
  sqlite3_int64 sVar5;
  Fts3Expr *pFVar6;
  int iVar7;
  Fts3Expr *pExpr_00;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  Fts3Table *pTab;
  long lVar11;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCsr = *pCtx;
  lVar9 = *(long *)((long)pCtx + 0x20);
  lVar8 = (long)(iPhrase * *(int *)((long)pCtx + 8) * 3);
  pCtx_00 = (pCsr->base).pVtab;
  if ((pExpr->bDeferred != '\0') && (pExpr->pParent->eType != 1)) {
    puVar10 = (undefined4 *)(lVar8 * 4 + 8 + lVar9);
    iVar7 = 0;
    for (lVar9 = 0; lVar9 < *(int *)&pCtx_00[2].pModule; lVar9 = lVar9 + 1) {
      uVar3 = (undefined4)pCsr->nDoc;
      puVar10[-1] = uVar3;
      *puVar10 = uVar3;
      puVar10 = puVar10 + 3;
    }
    goto LAB_001bc671;
  }
  if (pExpr->aMI == (u32 *)0x0) {
    sVar5 = pCsr->iPrevId;
    pFVar6 = pExpr;
    do {
      pExpr_00 = pFVar6;
      pFVar6 = pExpr_00->pParent;
      if (pFVar6 == (Fts3Expr *)0x0) break;
    } while ((pFVar6->eType == 1) || (pExpr_00->bDeferred != '\0'));
    lVar11 = pExpr_00->iDocid;
    uVar1 = pExpr_00->bEof;
    local_3c = sqlite3Fts3ExprIterate(pExpr_00,fts3AllocateMSI,pCtx_00);
    iVar7 = local_3c;
    if (local_3c != 0) goto LAB_001bc671;
    fts3EvalRestart(pCsr,pExpr_00,&local_3c);
    while ((pCsr->isEof == '\0' && (local_3c == 0))) {
      do {
        if (pCsr->isRequireSeek == '\0') {
          sqlite3_reset(pCsr->pStmt);
        }
        fts3EvalNextRow(pCsr,pExpr_00,&local_3c);
        uVar2 = pExpr_00->bEof;
        pCsr->isEof = uVar2;
        pCsr->isRequireSeek = '\x01';
        pCsr->isMatchinfoNeeded = 1;
        pCsr->iPrevId = pExpr_00->iDocid;
      } while (((uVar2 == '\0') && (pExpr_00->eType == 1)) &&
              (iVar7 = sqlite3Fts3EvalTestDeferred(pCsr,&local_3c), iVar7 != 0));
      if ((local_3c == 0) && (pCsr->isEof == '\0')) {
        fts3EvalUpdateCounts(pExpr_00,*(int *)&pCtx_00[2].pModule);
      }
    }
    pCsr->isEof = '\0';
    pCsr->iPrevId = sVar5;
    if (uVar1 == '\0') {
      fts3EvalRestart(pCsr,pExpr_00,&local_3c);
      do {
        fts3EvalNextRow(pCsr,pExpr_00,&local_3c);
        if (pExpr_00->bEof != '\0') {
          local_3c = 0x10b;
        }
      } while ((pExpr_00->iDocid != lVar11) && (local_3c == 0));
    }
    else {
      pExpr_00->bEof = uVar1;
    }
    iVar7 = local_3c;
    if (local_3c != 0) goto LAB_001bc671;
  }
  lVar9 = lVar8 * 4 + lVar9;
  lVar8 = 8;
  for (lVar11 = 0; iVar7 = 0, lVar11 < *(int *)&pCtx_00[2].pModule; lVar11 = lVar11 + 1) {
    puVar4 = pExpr->aMI;
    *(undefined4 *)(lVar9 + -4 + lVar8) = *(undefined4 *)((long)puVar4 + lVar8 + -4);
    *(undefined4 *)(lVar9 + lVar8) = *(undefined4 *)((long)puVar4 + lVar8);
    lVar8 = lVar8 + 0xc;
  }
LAB_001bc671:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}